

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Vector.H
# Opt level: O0

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *
amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
          (Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a)

{
  bool bVar1;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_RDI;
  MultiFab *x;
  iterator __end0;
  iterator __begin0;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *__range2;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *r;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *in_stack_ffffffffffffff98;
  __normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
  in_stack_ffffffffffffffc8;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffffd0;
  
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x5a3825);
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x5a382f);
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::begin(in_stack_ffffffffffffff98);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
                             *)in_RDI,
                            (__normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
    ::operator*((__normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
                 *)&stack0xffffffffffffffc8);
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
    ::operator++((__normal_iterator<amrex::MultiFab_*,_std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)in_RDI;
}

Assistant:

Vector<T*> GetVecOfPtrs (Vector<T>& a)
    {
        Vector<T*> r;
        r.reserve(a.size());
        for (auto& x : a)  r.push_back(&x);
        return r;
    }